

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O1

double __thiscall
ProbabEstimator::getProbabFast(ProbabEstimator *this,double *vecMaxs,int numReplaced,int pathLength)

{
  int numReplaced_00;
  double dVar1;
  double dVar2;
  
  numReplaced_00 = this->numMaxs;
  if (numReplaced == 0) {
    dVar1 = getProbabGtFast2(this,vecMaxs[(long)numReplaced_00 + -1],0,pathLength);
  }
  else if (numReplaced_00 == numReplaced) {
    dVar1 = getProbabLtFast2(this,*vecMaxs,numReplaced_00,pathLength);
  }
  else {
    dVar2 = getProbabLtFast2(this,vecMaxs[numReplaced_00 - numReplaced],numReplaced,pathLength);
    dVar1 = getProbabGtFast2(this,vecMaxs[~numReplaced + this->numMaxs],numReplaced,pathLength);
    dVar1 = dVar1 + dVar2;
  }
  return 1.0 - dVar1;
}

Assistant:

double ProbabEstimator::getProbabFast( const double *vecMaxs, const int numReplaced, const int pathLength ){
    if ( numReplaced == 0 ) return 1.0 - getProbabGtFast2( vecMaxs[numMaxs-1], 0, pathLength );
    if ( numReplaced == numMaxs ) return 1.0 - getProbabLtFast2( vecMaxs[0], numMaxs, pathLength );
    return 1.0 - getProbabLtFast2( vecMaxs[numMaxs-numReplaced], numReplaced, pathLength ) 
               - getProbabGtFast2( vecMaxs[numMaxs-numReplaced-1], numReplaced, pathLength );
}